

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-updating.cpp
# Opt level: O3

void __thiscall wasm::GlobalTypeRewriter::update(GlobalTypeRewriter *this)

{
  TypeBuilder *this_00;
  list<std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
  *plVar1;
  __index_type *this_01;
  __node_base *this_02;
  size_type *os;
  uint uVar2;
  _List_node_base *p_Var3;
  pointer pHVar4;
  char *pcVar5;
  Signature signature;
  undefined8 *puVar6;
  undefined8 uVar7;
  pointer pFVar8;
  bool bVar9;
  iterator iVar10;
  const_iterator cVar11;
  size_t sVar12;
  Type *pTVar13;
  Struct *__x;
  Type *pTVar14;
  Type TVar15;
  undefined4 extraout_var;
  iterator iVar16;
  HeapType super;
  variant_alternative_t<0UL,_variant<vector<HeapType,_allocator<HeapType>_>,_Error>_> *pvVar17;
  mapped_type *pmVar18;
  iterator iVar19;
  mapped_type *pmVar20;
  byte extraout_DL;
  key_type *__k;
  Field *field;
  iterator iVar21;
  _List_node_base *p_Var22;
  int iVar23;
  undefined1 auVar24 [8];
  __hashtable *__h;
  pair<std::_List_iterator<std::pair<const_wasm::HeapType,_bool>_>,_bool> pVar25;
  optional<wasm::HeapType> oVar26;
  pair<std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_bool> pVar27;
  undefined1 auStack_288 [8];
  TypeMap oldToNewTypes;
  _Hash_node_base _Stack_240;
  InsertOrderedMap<wasm::HeapType,_bool> local_238;
  GlobalTypeRewriter *pGStack_1e8;
  undefined1 local_f8 [8];
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> privateTypes;
  Type local_d8;
  Signature newSig;
  long local_b8;
  undefined1 local_a8 [8];
  Signature sig;
  iterator __end1;
  BuildResult buildResults;
  Iterator __begin3;
  uint local_34;
  
  wasm::ModuleUtils::getPrivateHeapTypes
            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_f8,this->wasm);
  oldToNewTypes._M_h._M_before_begin._M_nxt = &_Stack_240;
  oldToNewTypes._M_h._M_bucket_count = 0;
  auStack_288 = (undefined1  [8])0x0;
  oldToNewTypes._M_h._M_buckets = (__buckets_ptr)0x0;
  oldToNewTypes._M_h._M_element_count = 1;
  oldToNewTypes._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  oldToNewTypes._M_h._M_rehash_policy._4_4_ = 0;
  oldToNewTypes._M_h._M_rehash_policy._M_next_resize = 0;
  oldToNewTypes._M_h._M_single_bucket._0_4_ = 0x3f800000;
  _Stack_240._M_nxt = (_Hash_node_base *)0x0;
  local_238.Map._M_h._M_buckets = &local_238.Map._M_h._M_single_bucket;
  local_238.Map._M_h._M_bucket_count = 1;
  local_238.Map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_238.Map._M_h._M_element_count = 0;
  local_238.Map._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_238.Map._M_h._M_rehash_policy._M_next_resize = 0;
  local_238.Map._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_238.List.
  super__List_base<std::pair<const_wasm::HeapType,_bool>,_std::allocator<std::pair<const_wasm::HeapType,_bool>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_238.List;
  local_238.List.
  super__List_base<std::pair<const_wasm::HeapType,_bool>,_std::allocator<std::pair<const_wasm::HeapType,_bool>_>_>
  ._M_impl._M_node._M_size = 0;
  local_238.List.
  super__List_base<std::pair<const_wasm::HeapType,_bool>,_std::allocator<std::pair<const_wasm::HeapType,_bool>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       local_238.List.
       super__List_base<std::pair<const_wasm::HeapType,_bool>,_std::allocator<std::pair<const_wasm::HeapType,_bool>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  if (local_f8 !=
      (undefined1  [8])
      privateTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_start) {
    auVar24 = local_f8;
    do {
      __end1._M_node = (_List_node_base *)((pointer)auVar24)->id;
      buildResults.
      super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
      .
      super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
      .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u._0_8_
           = buildResults.
             super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
             .
             super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
             .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
             super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
             super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
             super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
             super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
             _M_u._0_8_ & 0xffffffffffffff00;
      pVar25 = InsertOrderedMap<wasm::HeapType,_bool>::insert
                         (&local_238,(pair<const_wasm::HeapType,_bool> *)&__end1);
      *(undefined1 *)&pVar25.first._M_node._M_node[1]._M_prev = 0;
      auVar24 = (undefined1  [8])((long)auVar24 + 8);
    } while (auVar24 !=
             (undefined1  [8])
             privateTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
             _M_impl.super__Vector_impl_data._M_start);
    if (local_238.List.
        super__List_base<std::pair<const_wasm::HeapType,_bool>,_std::allocator<std::pair<const_wasm::HeapType,_bool>_>_>
        ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_238.List) {
      p_Var22 = local_238.List.
                super__List_base<std::pair<const_wasm::HeapType,_bool>,_std::allocator<std::pair<const_wasm::HeapType,_bool>_>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      do {
        __end1._M_node = p_Var22[1]._M_next;
        buildResults.
        super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .
        super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u.
        _0_8_ = p_Var22[1]._M_prev;
        oVar26 = HeapType::getSuperType((HeapType *)&__end1);
        buildResults.
        super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .
        super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._24_8_ =
             oVar26.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::HeapType>._M_payload;
        if (((((undefined1  [16])
               oVar26.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) !=
              (undefined1  [16])0x0) &&
            (iVar10 = std::
                      _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_bool>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_bool>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      ::find((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_bool>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_bool>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                              *)&local_238,
                             (key_type *)
                             &buildResults.
                              super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                              .
                              super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                              .
                              super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              .
                              super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              .
                              super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              .
                              super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              .
                              super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              ._M_index),
            iVar10.
            super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_bool>_>_>,_true>
            ._M_cur != (__node_type *)0x0)) &&
           ((list<std::pair<const_wasm::HeapType,_bool>,_std::allocator<std::pair<const_wasm::HeapType,_bool>_>_>
             *)*(undefined1 **)
                ((long)iVar10.
                       super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_bool>_>_>,_true>
                       ._M_cur + 0x10) != &local_238.List)) {
          (*(undefined1 **)
            ((long)iVar10.
                   super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_bool>_>_>,_true>
                   ._M_cur + 0x10))[0x18] = 1;
        }
        p_Var22 = p_Var22->_M_next;
      } while (p_Var22 != (_List_node_base *)&local_238.List);
    }
    if (local_238.List.
        super__List_base<std::pair<const_wasm::HeapType,_bool>,_std::allocator<std::pair<const_wasm::HeapType,_bool>_>_>
        ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_238.List) {
      p_Var22 = local_238.List.
                super__List_base<std::pair<const_wasm::HeapType,_bool>,_std::allocator<std::pair<const_wasm::HeapType,_bool>_>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      do {
        if (((ulong)p_Var22[1]._M_prev & 1) == 0) {
          TopologicalSort<wasm::HeapType,_wasm::HeapTypeOrdering::SupertypesFirstBase<SupertypesFirst>_>
          ::push((TopologicalSort<wasm::HeapType,_wasm::HeapTypeOrdering::SupertypesFirstBase<SupertypesFirst>_>
                  *)auStack_288,(HeapType)p_Var22[1]._M_next);
        }
        p_Var22 = p_Var22->_M_next;
      } while (p_Var22 != (_List_node_base *)&local_238.List);
    }
  }
  pGStack_1e8 = this;
  TopologicalSort<wasm::HeapType,_wasm::HeapTypeOrdering::SupertypesFirstBase<SupertypesFirst>_>::
  stepToNext((TopologicalSort<wasm::HeapType,_wasm::HeapTypeOrdering::SupertypesFirstBase<SupertypesFirst>_>
              *)auStack_288);
  this_02 = &oldToNewTypes._M_h._M_before_begin;
  iVar23 = 0;
  while (auStack_288 != (undefined1  [8])oldToNewTypes._M_h._M_buckets) {
    __end1._M_node = (_List_node_base *)oldToNewTypes._M_h._M_buckets[-1];
    buildResults.
    super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
    .
    super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
    .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u._0_8_ =
         buildResults.
         super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
         .
         super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
         .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
         super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
         super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
         super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
         super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u.
         _0_8_ & 0xffffffff00000000;
    pVar27 = InsertOrderedMap<wasm::HeapType,_unsigned_int>::insert
                       (&this->typeIndices,(pair<const_wasm::HeapType,_unsigned_int> *)&__end1);
    *(int *)&pVar27.first._M_node._M_node[1]._M_prev = iVar23;
    __end1._M_node = (_List_node_base *)this_02;
    std::
    _Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<wasm::HeapType_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::HeapType,true>>>>
              ((_Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)this_02,oldToNewTypes._M_h._M_buckets + -1,
               (pair<const_wasm::HeapType,_unsigned_int> *)&__end1);
    iVar23 = iVar23 + 1;
    do {
      pFVar8 = (pointer)(oldToNewTypes._M_h._M_buckets + -1);
      if (auStack_288 == (undefined1  [8])pFVar8) break;
      __k = (key_type *)(oldToNewTypes._M_h._M_buckets + -2);
      oldToNewTypes._M_h._M_buckets = (__buckets_ptr)pFVar8;
      cVar11 = std::
               _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               ::find((_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                       *)this_02,__k);
      pFVar8 = (pointer)oldToNewTypes._M_h._M_buckets;
    } while (cVar11.super__Node_iterator_base<wasm::HeapType,_true>._M_cur != (__node_type *)0x0);
    oldToNewTypes._M_h._M_buckets = (__buckets_ptr)pFVar8;
    TopologicalSort<wasm::HeapType,_wasm::HeapTypeOrdering::SupertypesFirstBase<SupertypesFirst>_>::
    stepToNext((TopologicalSort<wasm::HeapType,_wasm::HeapTypeOrdering::SupertypesFirstBase<SupertypesFirst>_>
                *)auStack_288);
  }
  p_Var22 = local_238.List.
            super__List_base<std::pair<const_wasm::HeapType,_bool>,_std::allocator<std::pair<const_wasm::HeapType,_bool>_>_>
            ._M_impl._M_node.super__List_node_base._M_next;
  while (p_Var22 != (_List_node_base *)&local_238.List) {
    p_Var3 = (((_List_base<std::pair<const_wasm::HeapType,_bool>,_std::allocator<std::pair<const_wasm::HeapType,_bool>_>_>
                *)&p_Var22->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    operator_delete(p_Var22,0x20);
    p_Var22 = p_Var3;
  }
  std::
  _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_bool>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_bool>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_bool>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_bool>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&local_238);
  std::
  _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)this_02);
  if (auStack_288 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_288,oldToNewTypes._M_h._M_bucket_count - (long)auStack_288);
  }
  sVar12 = (this->typeIndices).Map._M_h._M_element_count;
  if (sVar12 != 0) {
    this_00 = &this->typeBuilder;
    TypeBuilder::grow(this_00,sVar12);
    sVar12 = TypeBuilder::size(this_00);
    TypeBuilder::createRecGroup(this_00,0,sVar12);
    plVar1 = &(this->typeIndices).List;
    p_Var22 = (this->typeIndices).List.
              super__List_base<std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
              ._M_impl._M_node.super__List_node_base._M_next;
    if (p_Var22 != (_List_node_base *)plVar1) {
      this_01 = &buildResults.
                 super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                 .
                 super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                 .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                 super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                 super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                 super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                 super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                 ._M_index;
      local_34 = 0;
      do {
        sig.results.id = (uintptr_t)p_Var22[1]._M_next;
        pTVar13 = &sig.results;
        bVar9 = HeapType::isSignature((HeapType *)pTVar13);
        if (bVar9) {
          _local_a8 = HeapType::getSignature((HeapType *)pTVar13);
          oldToNewTypes._M_h._M_bucket_count = 0;
          auStack_288 = (undefined1  [8])0x0;
          oldToNewTypes._M_h._M_buckets = (__buckets_ptr)0x0;
          buildResults.
          super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
          .
          super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
          .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u.
          _8_8_ = 0;
          __end1._M_node = (_List_node_base *)0x0;
          buildResults.
          super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
          .
          super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
          .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u.
          _0_8_ = 0;
          __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
               (Type *)0x0;
          buildResults.
          super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
          .
          super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
          .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._24_8_
               = (Type *)local_a8;
          pTVar13 = (Type *)wasm::Type::size((Type *)local_a8);
          bVar9 = (Type *)buildResults.
                          super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                          .
                          super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                          .
                          super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                          .
                          super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                          .
                          super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                          .
                          super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                          .
                          super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                          ._24_8_ != (Type *)local_a8;
          if (pTVar13 == (Type *)0x0) goto LAB_00aa2122;
          do {
            do {
              pTVar14 = wasm::Type::Iterator::operator*((Iterator *)this_01);
              newSig.results = getTempType(this,pTVar14->id);
              if (oldToNewTypes._M_h._M_buckets == (__buckets_ptr)oldToNewTypes._M_h._M_bucket_count
                 ) {
                std::vector<wasm::Type,_std::allocator<wasm::Type>_>::_M_realloc_insert<wasm::Type>
                          ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_288,
                           (iterator)oldToNewTypes._M_h._M_buckets,&newSig.results);
              }
              else {
                *oldToNewTypes._M_h._M_buckets = (__node_base_ptr)newSig.results.id;
                oldToNewTypes._M_h._M_buckets = oldToNewTypes._M_h._M_buckets + 1;
              }
              __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
                   (Type *)((long)&(__begin3.
                                    super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                   .parent)->id + 1);
              bVar9 = (undefined1 *)
                      buildResults.
                      super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                      .
                      super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                      .
                      super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                      .
                      super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                      .super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                      .super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                      .
                      super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                      ._24_8_ != local_a8;
            } while (__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                     parent != pTVar13);
LAB_00aa2122:
          } while (bVar9);
          buildResults.
          super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
          .
          super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
          .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._24_8_
               = &sig;
          __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
               (Type *)0x0;
          pTVar13 = (Type *)wasm::Type::size((Type *)buildResults.
                                                                                                          
                                                  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                                                  .
                                                  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                                                  .
                                                  super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                                  .
                                                  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                                  .
                                                  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                                  .
                                                  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                                  .
                                                  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                                  ._24_8_);
          if ((pTVar13 != (Type *)0x0) ||
             ((Signature *)
              buildResults.
              super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
              .
              super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
              .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
              super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
              super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
              super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
              super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
              _24_8_ != &sig)) {
            do {
              pTVar14 = wasm::Type::Iterator::operator*((Iterator *)this_01);
              newSig.results = getTempType(this,pTVar14->id);
              if (buildResults.
                  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                  .
                  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                  ._M_u._0_8_ ==
                  buildResults.
                  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                  .
                  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                  ._M_u._8_8_) {
                std::vector<wasm::Type,_std::allocator<wasm::Type>_>::_M_realloc_insert<wasm::Type>
                          ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&__end1,
                           (iterator)
                           buildResults.
                           super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                           .
                           super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                           .
                           super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                           .
                           super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                           .
                           super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                           .
                           super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                           .
                           super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                           ._M_u._0_8_,&newSig.results);
              }
              else {
                *(uintptr_t *)
                 buildResults.
                 super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                 .
                 super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                 .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                 super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                 super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                 super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                 super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                 ._M_u._0_8_ = newSig.results.id;
                buildResults.
                super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                .
                super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                _M_u._0_8_ = buildResults.
                             super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                             .
                             super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                             .
                             super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                             .
                             super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                             .
                             super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                             .
                             super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                             .
                             super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                             ._M_u._0_8_ + 8;
              }
              __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
                   (Type *)((long)&(__begin3.
                                    super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                   .parent)->id + 1);
            } while ((__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                      parent != pTVar13) ||
                    ((Signature *)
                     buildResults.
                     super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                     .
                     super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                     .
                     super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                     .
                     super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                     .super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                     super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                     super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                     ._24_8_ != &sig));
          }
          Tuple::Tuple((Tuple *)this_01,(TypeList *)auStack_288);
          TVar15 = TypeBuilder::getTempTupleType(this_00,(Tuple *)this_01);
          Tuple::Tuple((Tuple *)&newSig.results,(TypeList *)&__end1);
          newSig.params = TypeBuilder::getTempTupleType(this_00,(Tuple *)&newSig.results);
          local_d8 = TVar15;
          if (newSig.results.id != 0) {
            operator_delete((void *)newSig.results.id,local_b8 - newSig.results.id);
          }
          if (buildResults.
              super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
              .
              super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
              .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
              super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
              super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
              super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
              super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
              _24_8_ != 0) {
            operator_delete((void *)buildResults.
                                    super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                                    .
                                    super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                                    .
                                    super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                    .
                                    super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                    .
                                    super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                    .
                                    super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                    .
                                    super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                    ._24_8_,
                            __begin3.
                            super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                            index - buildResults.
                                    super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                                    .
                                    super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                                    .
                                    super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                    .
                                    super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                    .
                                    super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                    .
                                    super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                    .
                                    super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                    ._24_8_);
          }
          (*this->_vptr_GlobalTypeRewriter[4])(this,sig.results.id,&local_d8);
          signature.results.id = newSig.params.id;
          signature.params.id = local_d8.id;
          TypeBuilder::setHeapType(this_00,(ulong)local_34,signature);
LAB_00aa2268:
          if (__end1._M_node != (_List_node_base *)0x0) {
            operator_delete(__end1._M_node,
                            buildResults.
                            super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                            .
                            super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                            .
                            super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                            .
                            super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                            .
                            super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                            .
                            super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                            .
                            super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                            ._M_u._8_8_ - (long)__end1._M_node);
          }
          if (auStack_288 != (undefined1  [8])0x0) {
            operator_delete((void *)auStack_288,
                            oldToNewTypes._M_h._M_bucket_count - (long)auStack_288);
          }
        }
        else {
          bVar9 = HeapType::isStruct((HeapType *)pTVar13);
          if (bVar9) {
            __x = HeapType::getStruct((HeapType *)pTVar13);
            std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
                      ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_288,&__x->fields
                      );
            privateTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
            .super__Vector_impl_data._M_end_of_storage = (pointer)p_Var22;
            std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
                      ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)&__end1,
                       (vector<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_288);
            uVar7 = buildResults.
                    super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                    .
                    super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                    .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                    .super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                    .super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                    super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                    super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                    ._M_u._0_8_;
            for (iVar21 = __end1; iVar21._M_node != (_List_node_base *)uVar7;
                iVar21._M_node = iVar21._M_node + 1) {
              TVar15 = getTempType(this,(Type)(iVar21._M_node)->_M_next);
              (iVar21._M_node)->_M_next = (_List_node_base *)TVar15.id;
            }
            (*this->_vptr_GlobalTypeRewriter[2])(this,sig.results.id,(Struct *)&__end1);
            TypeBuilder::setHeapType(this_00,(ulong)local_34,(Struct *)&__end1);
            p_Var22 = (_List_node_base *)
                      privateTypes.
                      super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
            goto LAB_00aa2268;
          }
          bVar9 = HeapType::isArray((HeapType *)pTVar13);
          if (!bVar9) {
            handle_unreachable("bad type",
                               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/type-updating.cpp"
                               ,0x67);
          }
          HeapType::getArray((HeapType *)&__end1);
          uVar7 = buildResults.
                  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                  .
                  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                  ._M_u._0_8_;
          buildResults.
          super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
          .
          super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
          .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._24_8_
               = __end1._M_node;
          buildResults.
          super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
          .
          super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
          .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._24_8_
               = getTempType(this,(Type)__end1._M_node);
          (*this->_vptr_GlobalTypeRewriter[3])(this,sig.results.id,this_01);
          auStack_288 = (undefined1  [8])
                        buildResults.
                        super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                        .
                        super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                        .
                        super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                        .
                        super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                        .
                        super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                        .
                        super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                        .
                        super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                        ._24_8_;
          oldToNewTypes._M_h._M_buckets = (__buckets_ptr)uVar7;
          TypeBuilder::setHeapType(this_00,(ulong)local_34,(Array *)auStack_288);
        }
        iVar23 = (*this->_vptr_GlobalTypeRewriter[5])(this,sig.results.id);
        auStack_288 = (undefined1  [8])CONCAT44(extraout_var,iVar23);
        oldToNewTypes._M_h._M_buckets =
             (__buckets_ptr)CONCAT71(oldToNewTypes._M_h._M_buckets._1_7_,extraout_DL);
        if ((extraout_DL & 1) != 0) {
          iVar16 = std::
                   _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)&this->typeIndices,(key_type *)auStack_288);
          if ((iVar16.
               super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>,_true>
               ._M_cur == (__node_type *)0x0) ||
             ((list<std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
               *)*(undefined1 **)
                  ((long)iVar16.
                         super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>,_true>
                         ._M_cur + 0x10) == plVar1)) {
            TypeBuilder::setSubType(this_00,(ulong)local_34,(HeapType)auStack_288);
          }
          else {
            uVar2 = *(uint *)(*(undefined1 **)
                               ((long)iVar16.
                                      super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>,_true>
                                      ._M_cur + 0x10) + 0x18);
            if (local_34 <= uVar2) {
              __assert_fail("it->second < i",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/type-updating.cpp"
                            ,0x6d,"void wasm::GlobalTypeRewriter::update()");
            }
            super = TypeBuilder::getTempHeapType(this_00,(ulong)uVar2);
            TypeBuilder::setSubType(this_00,(ulong)local_34,super);
          }
        }
        local_34 = local_34 + 1;
        p_Var22 = p_Var22->_M_next;
      } while (p_Var22 != (_List_node_base *)plVar1);
    }
    TypeBuilder::build((BuildResult *)&__end1,this_00);
    if (buildResults.
        super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .
        super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u.
        _M_first._M_storage._M_storage[0x10] == '\x01') {
      Fatal::Fatal((Fatal *)auStack_288);
      os = &oldToNewTypes._M_h._M_bucket_count;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)os,"Internal GlobalTypeRewriter build error: ",0x29);
      wasm::operator<<((ostream *)os,
                       buildResults.
                       super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                       .
                       super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                       .
                       super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                       .
                       super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                       .
                       super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                       .
                       super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                       .
                       super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                       ._M_u._0_4_);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)os," at index ",10);
      Fatal::operator<<((Fatal *)auStack_288,(unsigned_long *)&__end1);
      Fatal::~Fatal((Fatal *)auStack_288);
    }
    pvVar17 = std::
              get<0ul,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,wasm::TypeBuilder::Error>
                        ((variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                          *)&__end1);
    auStack_288 = (undefined1  [8])&oldToNewTypes._M_h._M_rehash_policy._M_next_resize;
    oldToNewTypes._M_h._M_buckets = (__buckets_ptr)&DAT_00000001;
    oldToNewTypes._M_h._M_bucket_count = 0;
    oldToNewTypes._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    oldToNewTypes._M_h._M_element_count =
         CONCAT44(oldToNewTypes._M_h._M_element_count._4_4_,0x3f800000);
    oldToNewTypes._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    oldToNewTypes._M_h._M_rehash_policy._4_4_ = 0;
    oldToNewTypes._M_h._M_rehash_policy._M_next_resize = 0;
    p_Var22 = (plVar1->
              super__List_base<std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
              )._M_impl._M_node.super__List_node_base._M_next;
    if (p_Var22 != (_List_node_base *)plVar1) {
      do {
        buildResults.
        super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .
        super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._24_8_ =
             p_Var22[1]._M_next;
        p_Var3 = p_Var22[1]._M_prev;
        pHVar4 = (pvVar17->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        pmVar18 = std::__detail::
                  _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)auStack_288,
                               (key_type *)
                               &buildResults.
                                super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                                .
                                super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                                .
                                super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                .
                                super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                .
                                super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                .
                                super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                .
                                super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                ._M_index);
        pmVar18->id = pHVar4[(ulong)p_Var3 & 0xffffffff].id;
        p_Var22 = p_Var22->_M_next;
        puVar6 = (undefined8 *)oldToNewTypes._M_h._M_bucket_count;
      } while (p_Var22 != (_List_node_base *)plVar1);
      for (; puVar6 != (undefined8 *)0x0; puVar6 = (undefined8 *)*puVar6) {
        iVar19 = std::
                 _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&(this->wasm->typeNames)._M_h,(key_type *)(puVar6 + 1));
        if (iVar19.super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>
            ._M_cur != (__node_type *)0x0) {
          pmVar20 = std::__detail::
                    _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&this->wasm->typeNames,(key_type *)(puVar6 + 2));
          pcVar5 = *(char **)((long)iVar19.
                                    super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>
                                    ._M_cur + 0x18);
          (pmVar20->name).super_IString.str._M_len =
               *(size_t *)
                ((long)iVar19.
                       super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>
                       ._M_cur + 0x10);
          (pmVar20->name).super_IString.str._M_str = pcVar5;
          if ((mapped_type *)
              ((long)iVar19.
                     super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>
                     ._M_cur + 0x10) != pmVar20) {
            std::
            _Hashtable<unsigned_int,std::pair<unsigned_int_const,wasm::Name>,std::allocator<std::pair<unsigned_int_const,wasm::Name>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::
            _M_assign_elements<std::_Hashtable<unsigned_int,std::pair<unsigned_int_const,wasm::Name>,std::allocator<std::pair<unsigned_int_const,wasm::Name>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&>
                      ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,wasm::Name>,std::allocator<std::pair<unsigned_int_const,wasm::Name>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)&pmVar20->fieldNames,
                       (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        *)((long)iVar19.
                                 super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>
                                 ._M_cur + 0x20));
          }
        }
      }
    }
    mapTypes(this,(TypeMap *)auStack_288);
    std::
    _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)auStack_288);
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>_&>
      ::_S_vtable._M_arr
      [buildResults.
       super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
       .
       super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
       .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
       super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
       super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
       super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
       super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u.
       _M_first._M_storage._M_storage[0x10]]._M_data)
              ((anon_class_1_0_00000001 *)auStack_288,
               (variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                *)&__end1);
  }
  if (local_f8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_f8,
                    (long)privateTypes.
                          super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)local_f8);
  }
  return;
}

Assistant:

void GlobalTypeRewriter::update() {
  // Find the heap types that are not publicly observable. Even in a closed
  // world scenario, don't modify public types because we assume that they may
  // be reflected on or used for linking. Figure out where each private type
  // will be located in the builder. Sort the private types so that supertypes
  // come before their subtypes.
  Index i = 0;
  auto privateTypes = ModuleUtils::getPrivateHeapTypes(wasm);

  // Topological sort to have supertypes first, but we have to account for the
  // fact that we may be replacing the supertypes to get the order correct.
  struct SupertypesFirst
    : HeapTypeOrdering::SupertypesFirstBase<SupertypesFirst> {
    GlobalTypeRewriter& parent;

    SupertypesFirst(GlobalTypeRewriter& parent,
                    const std::vector<HeapType>& types)
      : SupertypesFirstBase(types), parent(parent) {}
    std::optional<HeapType> getSuperType(HeapType type) {
      return parent.getSuperType(type);
    }
  };

  for (auto type : SupertypesFirst(*this, privateTypes)) {
    typeIndices[type] = i++;
  }

  if (typeIndices.size() == 0) {
    return;
  }
  typeBuilder.grow(typeIndices.size());

  // All the input types are distinct, so we need to make sure the output types
  // are distinct as well. Further, the new types may have more recursions than
  // the original types, so the old recursion groups may not be sufficient any
  // more. Both of these problems are solved by putting all the new types into a
  // single large recursion group.
  typeBuilder.createRecGroup(0, typeBuilder.size());

  // Create the temporary heap types.
  i = 0;
  for (auto [type, _] : typeIndices) {
    if (type.isSignature()) {
      auto sig = type.getSignature();
      TypeList newParams, newResults;
      for (auto t : sig.params) {
        newParams.push_back(getTempType(t));
      }
      for (auto t : sig.results) {
        newResults.push_back(getTempType(t));
      }
      Signature newSig(typeBuilder.getTempTupleType(newParams),
                       typeBuilder.getTempTupleType(newResults));
      modifySignature(type, newSig);
      typeBuilder[i] = newSig;
    } else if (type.isStruct()) {
      auto struct_ = type.getStruct();
      // Start with a copy to get mutability/packing/etc.
      auto newStruct = struct_;
      for (auto& field : newStruct.fields) {
        field.type = getTempType(field.type);
      }
      modifyStruct(type, newStruct);
      typeBuilder[i] = newStruct;
    } else if (type.isArray()) {
      auto array = type.getArray();
      // Start with a copy to get mutability/packing/etc.
      auto newArray = array;
      newArray.element.type = getTempType(newArray.element.type);
      modifyArray(type, newArray);
      typeBuilder[i] = newArray;
    } else {
      WASM_UNREACHABLE("bad type");
    }

    // Apply a super, if there is one
    if (auto super = getSuperType(type)) {
      if (auto it = typeIndices.find(*super); it != typeIndices.end()) {
        assert(it->second < i);
        typeBuilder[i].subTypeOf(typeBuilder[it->second]);
      } else {
        typeBuilder[i].subTypeOf(*super);
      }
    }
    i++;
  }

  auto buildResults = typeBuilder.build();
#ifndef NDEBUG
  if (auto* err = buildResults.getError()) {
    Fatal() << "Internal GlobalTypeRewriter build error: " << err->reason
            << " at index " << err->index;
  }
#endif
  auto& newTypes = *buildResults;

  // Map the old types to the new ones.
  TypeMap oldToNewTypes;
  for (auto [type, index] : typeIndices) {
    oldToNewTypes[type] = newTypes[index];
  }

  // Update type names (doing it before mapTypes can help debugging there, but
  // has no other effect; mapTypes does not look at type names).
  for (auto& [old, new_] : oldToNewTypes) {
    if (auto it = wasm.typeNames.find(old); it != wasm.typeNames.end()) {
      wasm.typeNames[new_] = it->second;
    }
  }

  mapTypes(oldToNewTypes);
}